

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineRenderToImageTests.cpp
# Opt level: O3

Move<vk::Handle<(vk::HandleType)18>_> *
vkt::pipeline::anon_unknown_0::makeGraphicsPipeline
          (Move<vk::Handle<(vk::HandleType)18>_> *__return_storage_ptr__,DeviceInterface *vk,
          VkDevice device,VkPipeline basePipeline,VkPipelineLayout pipelineLayout,
          VkRenderPass renderPass,VkShaderModule vertexModule,VkShaderModule fragmentModule,
          IVec2 *renderSize,VkPrimitiveTopology topology,deUint32 subpass,bool useDepth,
          bool useStencil)

{
  Move<vk::Handle<(vk::HandleType)18>_> *pMVar1;
  VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState;
  VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo;
  VkVertexInputAttributeDescription vertexInputAttributeDescriptions [2];
  VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo;
  VkPipelineViewportStateCreateInfo pipelineViewportStateInfo;
  VkPipelineVertexInputStateCreateInfo vertexInputStateInfo;
  VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo;
  VkPipelineShaderStageCreateInfo pShaderStages [2];
  VkGraphicsPipelineCreateInfo graphicsPipelineInfo;
  VkVertexInputBindingDescription local_330;
  VkRect2D local_320;
  VkViewport local_310;
  VkPipelineColorBlendAttachmentState local_2f8;
  VkPipelineInputAssemblyStateCreateInfo local_2d8;
  VkVertexInputAttributeDescription local_2b8;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  VkPipelineMultisampleStateCreateInfo local_298;
  VkPipelineViewportStateCreateInfo local_260;
  VkPipelineVertexInputStateCreateInfo local_230;
  VkPipelineColorBlendStateCreateInfo local_200;
  VkPipelineRasterizationStateCreateInfo local_1c8;
  VkPipelineShaderStageCreateInfo local_188;
  undefined4 local_158;
  undefined8 local_150;
  undefined8 local_148;
  deUint64 local_140;
  char *local_138;
  undefined8 local_130;
  VkPipelineDepthStencilStateCreateInfo local_128;
  VkGraphicsPipelineCreateInfo local_c0;
  
  local_230.pVertexBindingDescriptions = &local_330;
  local_330.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  local_330.binding = 0;
  local_330.stride = 0x20;
  local_230.pVertexAttributeDescriptions = &local_2b8;
  local_2a8 = 1;
  uStack_2a0 = 0x100000006d;
  local_2b8.location = 0;
  local_2b8.binding = 0;
  local_2b8.format = VK_FORMAT_R32G32B32A32_SFLOAT;
  local_2b8.offset = 0;
  local_c0.pVertexInputState = &local_230;
  local_230.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  local_230.pNext = (void *)0x0;
  local_230.flags = 0;
  local_230.vertexBindingDescriptionCount = 1;
  local_230.vertexAttributeDescriptionCount = 2;
  local_310.width = (float)(int)(deUint32)renderSize;
  local_310.height = (float)(int)topology;
  local_260.pViewports = &local_310;
  local_310.x = 0.0;
  local_310.y = 0.0;
  local_310.minDepth = 0.0;
  local_310.maxDepth = 1.0;
  local_260.pScissors = &local_320;
  local_320.offset.x = 0;
  local_320.offset.y = 0;
  local_320.extent.height = topology;
  local_320.extent.width = (deUint32)renderSize;
  local_c0.pViewportState = &local_260;
  local_260.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  local_260.pNext = (void *)0x0;
  local_260.flags = 0;
  local_260.viewportCount = 1;
  local_260.scissorCount = 1;
  local_c0.pMultisampleState = &local_298;
  local_298.pNext = (void *)0x0;
  local_298.sampleShadingEnable = 0;
  local_298.minSampleShading = 0.0;
  local_298.pSampleMask = (VkSampleMask *)0x0;
  local_298.alphaToCoverageEnable = 0;
  local_298.alphaToOneEnable = 0;
  local_298.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  local_298._4_4_ = 0;
  local_298.flags = 0;
  local_298.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
  local_c0.pDepthStencilState = &local_128;
  local_128.sType = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  local_128.pNext = (void *)0x0;
  local_128.flags = 0;
  local_128.depthTestEnable = (VkBool32)useDepth;
  local_128.depthWriteEnable = 0;
  local_128.depthCompareOp = VK_COMPARE_OP_LESS;
  local_128.depthBoundsTestEnable = 0;
  local_128.stencilTestEnable = (VkBool32)useStencil;
  local_128.front.failOp = VK_STENCIL_OP_KEEP;
  local_128.front.passOp = VK_STENCIL_OP_ZERO;
  local_128.front.depthFailOp = VK_STENCIL_OP_KEEP;
  local_128.front.compareOp = VK_COMPARE_OP_EQUAL;
  local_128.front.compareMask = 0xffffffff;
  local_128.front.writeMask = 0xffffffff;
  local_128.front.reference = 0x2a;
  local_128.back.failOp = VK_STENCIL_OP_KEEP;
  local_128.back.passOp = VK_STENCIL_OP_ZERO;
  local_128.back.depthFailOp = VK_STENCIL_OP_KEEP;
  local_128.back.compareOp = VK_COMPARE_OP_EQUAL;
  local_128.back.compareMask = 0xffffffff;
  local_128.back.writeMask = 0xffffffff;
  local_128.back.reference = 0x2a;
  local_c0.pColorBlendState = &local_200;
  local_200.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_200.pNext = (void *)0x0;
  local_200.flags = 0;
  local_200.logicOpEnable = 0;
  local_200.logicOp = VK_LOGIC_OP_COPY;
  local_200.attachmentCount = 1;
  local_200.pAttachments = &local_2f8;
  local_2f8.srcAlphaBlendFactor = VK_BLEND_FACTOR_ONE;
  local_2f8.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  local_2f8.alphaBlendOp = VK_BLEND_OP_ADD;
  local_2f8.colorWriteMask = 0xf;
  local_2f8.blendEnable = 0;
  local_2f8.srcColorBlendFactor = VK_BLEND_FACTOR_ONE;
  local_2f8.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  local_2f8.colorBlendOp = VK_BLEND_OP_ADD;
  local_c0.pStages = &local_188;
  local_188.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  local_188.pNext = (void *)0x0;
  local_188.flags = 0;
  local_188.stage = VK_SHADER_STAGE_VERTEX_BIT;
  local_188.module.m_internal = vertexModule.m_internal;
  local_188.pName = "main";
  local_188.pSpecializationInfo = (VkSpecializationInfo *)0x0;
  local_158 = 0x12;
  local_150 = 0;
  local_148 = 0x1000000000;
  local_140 = fragmentModule.m_internal;
  local_138 = "main";
  local_c0.flags = (uint)(basePipeline.m_internal != 0) * 2 + 2;
  local_c0.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  local_c0.pNext = (void *)0x0;
  local_c0.stageCount = 2;
  local_130 = 0;
  local_c0.pInputAssemblyState = &local_2d8;
  local_2d8.pNext = (void *)0x0;
  local_2d8.primitiveRestartEnable = 0;
  local_2d8._28_4_ = 0;
  local_2d8.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  local_2d8._4_4_ = 0;
  local_2d8.flags = 0;
  local_2d8.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
  local_c0.pTessellationState = (VkPipelineTessellationStateCreateInfo *)0x0;
  local_c0.pRasterizationState = &local_1c8;
  local_1c8.pNext = (void *)0x0;
  local_1c8.depthBiasClamp = 0.0;
  local_1c8.depthBiasSlopeFactor = 0.0;
  local_1c8.cullMode = 0;
  local_1c8.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  local_1c8.depthBiasEnable = 0;
  local_1c8.depthBiasConstantFactor = 0.0;
  local_1c8.flags = 0;
  local_1c8.depthClampEnable = 0;
  local_1c8.rasterizerDiscardEnable = 0;
  local_1c8.polygonMode = VK_POLYGON_MODE_FILL;
  local_1c8.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  local_1c8._4_4_ = 0;
  local_1c8.lineWidth = 1.0;
  local_1c8._60_4_ = 0;
  local_128.minDepthBounds = 0.0;
  local_128.maxDepthBounds = 1.0;
  local_200.blendConstants[0] = 0.0;
  local_200.blendConstants[1] = 0.0;
  local_200.blendConstants[2] = 0.0;
  local_200.blendConstants[3] = 0.0;
  local_c0.pDynamicState = (VkPipelineDynamicStateCreateInfo *)0x0;
  local_c0.subpass = subpass;
  local_c0.basePipelineIndex = -1;
  local_c0.layout.m_internal = pipelineLayout.m_internal;
  local_c0.renderPass.m_internal = renderPass.m_internal;
  local_c0.basePipelineHandle.m_internal = basePipeline.m_internal;
  pMVar1 = ::vk::createGraphicsPipeline
                     (__return_storage_ptr__,vk,device,(VkPipelineCache)0x0,&local_c0,
                      (VkAllocationCallbacks *)0x0);
  return pMVar1;
}

Assistant:

Move<VkPipeline> makeGraphicsPipeline (const DeviceInterface&		vk,
									   const VkDevice				device,
									   const VkPipeline				basePipeline,		// for derivatives
									   const VkPipelineLayout		pipelineLayout,
									   const VkRenderPass			renderPass,
									   const VkShaderModule			vertexModule,
									   const VkShaderModule			fragmentModule,
									   const IVec2&					renderSize,
									   const VkPrimitiveTopology	topology,
									   const deUint32				subpass,
									   const bool					useDepth,
									   const bool					useStencil)
{
	const VkVertexInputBindingDescription vertexInputBindingDescription =
	{
		0u,								// uint32_t				binding;
		sizeof(Vertex4RGBA),			// uint32_t				stride;
		VK_VERTEX_INPUT_RATE_VERTEX,	// VkVertexInputRate	inputRate;
	};

	const VkVertexInputAttributeDescription vertexInputAttributeDescriptions[] =
	{
		{
			0u,								// uint32_t			location;
			0u,								// uint32_t			binding;
			VK_FORMAT_R32G32B32A32_SFLOAT,	// VkFormat			format;
			0u,								// uint32_t			offset;
		},
		{
			1u,								// uint32_t			location;
			0u,								// uint32_t			binding;
			VK_FORMAT_R32G32B32A32_SFLOAT,	// VkFormat			format;
			sizeof(Vec4),					// uint32_t			offset;
		}
	};

	const VkPipelineVertexInputStateCreateInfo vertexInputStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,	// VkStructureType							sType;
		DE_NULL,													// const void*								pNext;
		(VkPipelineVertexInputStateCreateFlags)0,					// VkPipelineVertexInputStateCreateFlags	flags;
		1u,															// uint32_t									vertexBindingDescriptionCount;
		&vertexInputBindingDescription,								// const VkVertexInputBindingDescription*	pVertexBindingDescriptions;
		DE_LENGTH_OF_ARRAY(vertexInputAttributeDescriptions),		// uint32_t									vertexAttributeDescriptionCount;
		vertexInputAttributeDescriptions,							// const VkVertexInputAttributeDescription*	pVertexAttributeDescriptions;
	};

	const VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,	// VkStructureType							sType;
		DE_NULL,														// const void*								pNext;
		(VkPipelineInputAssemblyStateCreateFlags)0,						// VkPipelineInputAssemblyStateCreateFlags	flags;
		topology,														// VkPrimitiveTopology						topology;
		VK_FALSE,														// VkBool32									primitiveRestartEnable;
	};

	const VkViewport viewport = makeViewport(
		0.0f, 0.0f,
		static_cast<float>(renderSize.x()), static_cast<float>(renderSize.y()),
		0.0f, 1.0f);

	const VkRect2D scissor =
	{
		makeOffset2D(0, 0),
		makeExtent2D(renderSize.x(), renderSize.y()),
	};

	const VkPipelineViewportStateCreateInfo pipelineViewportStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,	// VkStructureType						sType;
		DE_NULL,												// const void*							pNext;
		(VkPipelineViewportStateCreateFlags)0,					// VkPipelineViewportStateCreateFlags	flags;
		1u,														// uint32_t								viewportCount;
		&viewport,												// const VkViewport*					pViewports;
		1u,														// uint32_t								scissorCount;
		&scissor,												// const VkRect2D*						pScissors;
	};

	const VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,	// VkStructureType							sType;
		DE_NULL,													// const void*								pNext;
		(VkPipelineRasterizationStateCreateFlags)0,					// VkPipelineRasterizationStateCreateFlags	flags;
		VK_FALSE,													// VkBool32									depthClampEnable;
		VK_FALSE,													// VkBool32									rasterizerDiscardEnable;
		VK_POLYGON_MODE_FILL,										// VkPolygonMode							polygonMode;
		VK_CULL_MODE_NONE,											// VkCullModeFlags							cullMode;
		VK_FRONT_FACE_COUNTER_CLOCKWISE,							// VkFrontFace								frontFace;
		VK_FALSE,													// VkBool32									depthBiasEnable;
		0.0f,														// float									depthBiasConstantFactor;
		0.0f,														// float									depthBiasClamp;
		0.0f,														// float									depthBiasSlopeFactor;
		1.0f,														// float									lineWidth;
	};

	const VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,	// VkStructureType							sType;
		DE_NULL,													// const void*								pNext;
		(VkPipelineMultisampleStateCreateFlags)0,					// VkPipelineMultisampleStateCreateFlags	flags;
		VK_SAMPLE_COUNT_1_BIT,										// VkSampleCountFlagBits					rasterizationSamples;
		VK_FALSE,													// VkBool32									sampleShadingEnable;
		0.0f,														// float									minSampleShading;
		DE_NULL,													// const VkSampleMask*						pSampleMask;
		VK_FALSE,													// VkBool32									alphaToCoverageEnable;
		VK_FALSE													// VkBool32									alphaToOneEnable;
	};

	const VkStencilOpState stencilOpState = makeStencilOpState(
		VK_STENCIL_OP_KEEP,									// stencil fail
		VK_STENCIL_OP_ZERO,									// depth & stencil pass
		VK_STENCIL_OP_KEEP,									// depth only fail
		VK_COMPARE_OP_EQUAL,								// compare op
		~0u,												// compare mask
		~0u,												// write mask
		static_cast<deUint32>(REFERENCE_STENCIL_VALUE));	// reference

	VkPipelineDepthStencilStateCreateInfo pipelineDepthStencilStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO,	// VkStructureType							sType;
		DE_NULL,													// const void*								pNext;
		(VkPipelineDepthStencilStateCreateFlags)0,					// VkPipelineDepthStencilStateCreateFlags	flags;
		useDepth,													// VkBool32									depthTestEnable;
		VK_FALSE,													// VkBool32									depthWriteEnable;
		VK_COMPARE_OP_LESS,											// VkCompareOp								depthCompareOp;
		VK_FALSE,													// VkBool32									depthBoundsTestEnable;
		useStencil,													// VkBool32									stencilTestEnable;
		stencilOpState,												// VkStencilOpState							front;
		stencilOpState,												// VkStencilOpState							back;
		0.0f,														// float									minDepthBounds;
		1.0f,														// float									maxDepthBounds;
	};

	const VkColorComponentFlags colorComponentsAll = VK_COLOR_COMPONENT_R_BIT | VK_COLOR_COMPONENT_G_BIT | VK_COLOR_COMPONENT_B_BIT | VK_COLOR_COMPONENT_A_BIT;
	// Number of blend attachments must equal the number of color attachments during any subpass.
	const VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState =
	{
		VK_FALSE,				// VkBool32					blendEnable;
		VK_BLEND_FACTOR_ONE,	// VkBlendFactor			srcColorBlendFactor;
		VK_BLEND_FACTOR_ZERO,	// VkBlendFactor			dstColorBlendFactor;
		VK_BLEND_OP_ADD,		// VkBlendOp				colorBlendOp;
		VK_BLEND_FACTOR_ONE,	// VkBlendFactor			srcAlphaBlendFactor;
		VK_BLEND_FACTOR_ZERO,	// VkBlendFactor			dstAlphaBlendFactor;
		VK_BLEND_OP_ADD,		// VkBlendOp				alphaBlendOp;
		colorComponentsAll,		// VkColorComponentFlags	colorWriteMask;
	};

	const VkPipelineColorBlendStateCreateInfo pipelineColorBlendStateInfo =
	{
		VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,	// VkStructureType								sType;
		DE_NULL,													// const void*									pNext;
		(VkPipelineColorBlendStateCreateFlags)0,					// VkPipelineColorBlendStateCreateFlags			flags;
		VK_FALSE,													// VkBool32										logicOpEnable;
		VK_LOGIC_OP_COPY,											// VkLogicOp									logicOp;
		1u,															// deUint32										attachmentCount;
		&pipelineColorBlendAttachmentState,							// const VkPipelineColorBlendAttachmentState*	pAttachments;
		{ 0.0f, 0.0f, 0.0f, 0.0f },									// float										blendConstants[4];
	};

	const VkPipelineShaderStageCreateInfo pShaderStages[] =
	{
		{
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// VkStructureType						sType;
			DE_NULL,												// const void*							pNext;
			(VkPipelineShaderStageCreateFlags)0,					// VkPipelineShaderStageCreateFlags		flags;
			VK_SHADER_STAGE_VERTEX_BIT,								// VkShaderStageFlagBits				stage;
			vertexModule,											// VkShaderModule						module;
			"main",													// const char*							pName;
			DE_NULL,												// const VkSpecializationInfo*			pSpecializationInfo;
		},
		{
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// VkStructureType						sType;
			DE_NULL,												// const void*							pNext;
			(VkPipelineShaderStageCreateFlags)0,					// VkPipelineShaderStageCreateFlags		flags;
			VK_SHADER_STAGE_FRAGMENT_BIT,							// VkShaderStageFlagBits				stage;
			fragmentModule,											// VkShaderModule						module;
			"main",													// const char*							pName;
			DE_NULL,												// const VkSpecializationInfo*			pSpecializationInfo;
		}
	};

	const VkPipelineCreateFlags			flags = (basePipeline == DE_NULL ? VK_PIPELINE_CREATE_ALLOW_DERIVATIVES_BIT
																		 : VK_PIPELINE_CREATE_DERIVATIVE_BIT);

	const VkGraphicsPipelineCreateInfo	graphicsPipelineInfo =
	{
		VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,	// VkStructureType									sType;
		DE_NULL,											// const void*										pNext;
		flags,												// VkPipelineCreateFlags							flags;
		DE_LENGTH_OF_ARRAY(pShaderStages),					// deUint32											stageCount;
		pShaderStages,										// const VkPipelineShaderStageCreateInfo*			pStages;
		&vertexInputStateInfo,								// const VkPipelineVertexInputStateCreateInfo*		pVertexInputState;
		&pipelineInputAssemblyStateInfo,					// const VkPipelineInputAssemblyStateCreateInfo*	pInputAssemblyState;
		DE_NULL,											// const VkPipelineTessellationStateCreateInfo*		pTessellationState;
		&pipelineViewportStateInfo,							// const VkPipelineViewportStateCreateInfo*			pViewportState;
		&pipelineRasterizationStateInfo,					// const VkPipelineRasterizationStateCreateInfo*	pRasterizationState;
		&pipelineMultisampleStateInfo,						// const VkPipelineMultisampleStateCreateInfo*		pMultisampleState;
		&pipelineDepthStencilStateInfo,						// const VkPipelineDepthStencilStateCreateInfo*		pDepthStencilState;
		&pipelineColorBlendStateInfo,						// const VkPipelineColorBlendStateCreateInfo*		pColorBlendState;
		DE_NULL,											// const VkPipelineDynamicStateCreateInfo*			pDynamicState;
		pipelineLayout,										// VkPipelineLayout									layout;
		renderPass,											// VkRenderPass										renderPass;
		subpass,											// deUint32											subpass;
		basePipeline,										// VkPipeline										basePipelineHandle;
		-1,													// deInt32											basePipelineIndex;
	};

	return createGraphicsPipeline(vk, device, DE_NULL, &graphicsPipelineInfo);
}